

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMParentNode.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DOMParentNode::normalize(DOMParentNode *this)

{
  DOMNode *oldChild;
  DOMNode *pDVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  undefined4 extraout_var;
  DOMException *this_00;
  
  oldChild = this->fFirstChild;
  while( true ) {
    pDVar1 = oldChild;
    if (pDVar1 == (DOMNode *)0x0) {
      return;
    }
    plVar3 = (long *)__dynamic_cast(pDVar1,&DOMNode::typeinfo,&HasDOMChildImpl::typeinfo,
                                    0xfffffffffffffffe);
    if ((plVar3 == (long *)0x0) || (lVar4 = (**(code **)(*plVar3 + 0x10))(plVar3), lVar4 == 0))
    break;
    lVar4 = (**(code **)(*plVar3 + 0x10))(plVar3);
    oldChild = *(DOMNode **)(lVar4 + 8);
    if (((oldChild == (DOMNode *)0x0) || (iVar2 = (*pDVar1->_vptr_DOMNode[4])(pDVar1), iVar2 != 3))
       || (iVar2 = (*oldChild->_vptr_DOMNode[4])(oldChild), iVar2 != 3)) {
      iVar2 = (*pDVar1->_vptr_DOMNode[4])(pDVar1);
      if (iVar2 == 1) {
        (*pDVar1->_vptr_DOMNode[0x14])(pDVar1);
      }
    }
    else {
      iVar2 = (*oldChild->_vptr_DOMNode[0x28])(oldChild);
      (*pDVar1->_vptr_DOMNode[0x2b])(pDVar1,CONCAT44(extraout_var,iVar2));
      removeChild(this,oldChild);
      oldChild = pDVar1;
    }
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMParentNode::normalize()
{
    DOMNode *kid, *next;
    for (kid = fFirstChild; kid != 0; kid = next)
    {
        next = castToChildImpl(kid)->nextSibling;

        // If kid and next are both Text nodes (but _not_ CDATASection,
        // which is a subclass of Text), they can be merged.
        if (next != 0 &&
            kid->getNodeType() == DOMNode::TEXT_NODE   &&
            next->getNodeType() == DOMNode::TEXT_NODE )
        {
            ((DOMTextImpl *) kid)->appendData(((DOMTextImpl *) next)->getData());
            // revisit:
            //   should I release the removed node?
            //   not released in case user still referencing it externally
            removeChild(next);
            next = kid; // Don't advance; there might be another.
        }

        // Otherwise it might be an Element, which is handled recursively
        else
            if (kid->getNodeType() == DOMNode::ELEMENT_NODE)
                kid->normalize();
    }

    // changed() will have occurred when the removeChild() was done,
    // so does not have to be reissued.
}